

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall
dtc::fdt::property::parse_cells(property *this,text_input_buffer *input,int cell_size)

{
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Elt_pointer psVar2;
  element_type *peVar3;
  ushort uVar4;
  pointer puVar5;
  pointer puVar6;
  _Elt_pointer psVar7;
  long *plVar8;
  int iVar9;
  uint uVar10;
  ulong *puVar11;
  size_type *psVar12;
  _Elt_pointer psVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint __len;
  int bit;
  long lVar17;
  bool bVar18;
  unsigned_long_long val;
  string referenced;
  string msg;
  property_value v;
  string __str;
  undefined1 local_1c8;
  undefined1 uStack_1c7;
  undefined2 uStack_1c6;
  undefined4 uStack_1c4;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  ulong local_1a0;
  string local_198;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  pointer local_158;
  pointer puStack_150;
  pointer local_148;
  value_type local_140;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *local_138;
  uint local_12c;
  undefined1 local_128 [32];
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  value_type local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  ulong local_88;
  ulong local_80;
  long local_78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  psVar2 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar7 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar7 != psVar2) {
    psVar13 = psVar7;
    if (psVar7 == (input->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar13 = (input->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar13[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar9 = peVar3->cursor;
    if (((-1 < (long)iVar9) && (iVar9 < peVar3->size)) && (peVar3->buffer[iVar9] == '<')) {
      this_00 = &input->input_stack;
      if (psVar7 != psVar2) {
        input->cursor = input->cursor + 1;
        if (psVar7 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar7 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar9 = peVar3->cursor + 1;
        peVar3->cursor = iVar9;
        if (peVar3->size <= iVar9) {
          std::
          deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
          ::pop_back(&this_00->c);
        }
      }
      local_48 = 0;
      local_40 = 0;
      local_128._0_8_ = local_128 + 0x10;
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char*>((string *)local_128,&local_40,&local_40);
      local_108._M_p = (pointer)&local_f8;
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0 = UNKNOWN;
      local_1a0 = (ulong)(uint)cell_size;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      text_input_buffer::next_token(input);
      local_80 = local_1a0 & 0xffffffff;
      local_88 = ~(-1L << ((char)local_1a0 - 1U & 0x3f));
      local_12c = (int)local_1a0 << 0x1d | (int)local_1a0 - 8U >> 3;
      paVar1 = &local_198.field_2;
      local_138 = &this->values;
      do {
        while( true ) {
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          psVar7 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar7 == psVar2) {
            bVar18 = false;
          }
          else {
            psVar13 = psVar7;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar13 = (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar13[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor;
            bVar18 = false;
            if ((-1 < (long)iVar9) && (iVar9 < peVar3->size)) {
              bVar18 = peVar3->buffer[iVar9] == '>';
            }
          }
          if ((psVar7 != psVar2) && (bVar18)) {
            input->cursor = input->cursor + 1;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor + 1;
            peVar3->cursor = iVar9;
            if (peVar3->size <= iVar9) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          if (bVar18) {
            if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
              push_back(local_138,(value_type *)local_128);
            }
            goto LAB_001219d2;
          }
          text_input_buffer::next_token(input);
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          psVar7 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar7 == psVar2) {
            bVar18 = false;
          }
          else {
            psVar13 = psVar7;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar13 = (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar13[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor;
            bVar18 = false;
            if ((-1 < (long)iVar9) && (iVar9 < peVar3->size)) {
              bVar18 = peVar3->buffer[iVar9] == '&';
            }
          }
          if ((psVar7 != psVar2) && (bVar18)) {
            input->cursor = input->cursor + 1;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor + 1;
            peVar3->cursor = iVar9;
            if (peVar3->size <= iVar9) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          if (bVar18) break;
          bVar18 = text_input_buffer::consume_integer_expression
                             (input,(unsigned_long_long *)&local_1c8);
          if (!bVar18) {
            text_input_buffer::parse_error(input,"Expected numbers in array of cells");
LAB_001219ca:
            this->valid = false;
            goto LAB_001219d2;
          }
          if ((((int)(uint)local_1a0 < 0x40) &&
              (uVar14 = CONCAT44(uStack_1c4,CONCAT22(uStack_1c6,CONCAT11(uStack_1c7,local_1c8))),
              uVar14 >> ((byte)local_80 & 0x3f) != 0)) &&
             ((uVar14 | local_88) != 0xffffffffffffffff)) {
            uVar15 = -(uint)local_1a0;
            if (0 < (int)(uint)local_1a0) {
              uVar15 = (uint)local_1a0;
            }
            __len = 1;
            if (uVar15 < 10) goto LAB_00121aab;
            uVar14 = (ulong)uVar15;
            uVar16 = 4;
            goto LAB_00121a6f;
          }
          switch(local_12c) {
          case 0:
            local_198._M_dataplus._M_p._0_1_ = local_1c8;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&local_e8,(uchar *)&local_198);
            break;
          case 1:
            uVar4 = CONCAT11(uStack_1c7,local_1c8);
            iVar9 = 8;
            do {
              local_198._M_dataplus._M_p._0_1_ = (char)(uVar4 >> ((byte)iVar9 & 0x1f));
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(&local_e8,(uchar *)&local_198);
              iVar9 = iVar9 + -8;
            } while (iVar9 != -8);
            break;
          default:
            __assert_fail("0 && \"Invalid cell size!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                          ,0x176,"void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
          case 3:
            uVar15 = CONCAT22(uStack_1c6,CONCAT11(uStack_1c7,local_1c8));
            iVar9 = 0x18;
            do {
              local_198._M_dataplus._M_p._0_1_ = (char)(uVar15 >> ((byte)iVar9 & 0x1f));
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(&local_e8,(uchar *)&local_198);
              iVar9 = iVar9 + -8;
            } while (iVar9 != -8);
            break;
          case 7:
            lVar17 = 0x38;
            uVar14 = CONCAT44(uStack_1c4,CONCAT22(uStack_1c6,CONCAT11(uStack_1c7,local_1c8)));
            do {
              local_198._M_dataplus._M_p._0_1_ = (char)(uVar14 >> ((byte)lVar17 & 0x3f));
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(&local_e8,(uchar *)&local_198);
              lVar17 = lVar17 + -8;
            } while (lVar17 != -8);
          }
          text_input_buffer::next_token(input);
        }
        if ((uint)local_1a0 != 0x20) {
          text_input_buffer::parse_error(input,"reference only permitted in 32-bit arrays");
          goto LAB_001219ca;
        }
        text_input_buffer::next_token(input);
        local_1b8 = 0;
        local_1b0 = local_1b0 & 0xffffffffffffff00;
        psVar2 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar7 == psVar2) {
          bVar18 = false;
        }
        else {
          psVar13 = psVar7;
          if (psVar7 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar13 = (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar13[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar9 = peVar3->cursor;
          bVar18 = false;
          if ((-1 < (long)iVar9) && (iVar9 < peVar3->size)) {
            bVar18 = peVar3->buffer[iVar9] == '{';
          }
        }
        local_1c0 = &local_1b0;
        if ((psVar7 != psVar2) && (bVar18)) {
          input->cursor = input->cursor + 1;
          if (psVar7 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar7 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar9 = peVar3->cursor + 1;
          peVar3->cursor = iVar9;
          if (peVar3->size <= iVar9) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&this_00->c);
          }
        }
        if (bVar18) {
          text_input_buffer::parse_to_abi_cxx11_(&local_198,input,'}');
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar1) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          psVar7 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          bVar18 = true;
          if (psVar7 != psVar2) {
            psVar13 = psVar7;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar13 = (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar13[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor;
            if ((-1 < (long)iVar9) && (iVar9 < peVar3->size)) {
              bVar18 = peVar3->buffer[iVar9] != '}';
            }
          }
          if ((psVar7 != psVar2) && (!bVar18)) {
            input->cursor = input->cursor + 1;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor + 1;
            peVar3->cursor = iVar9;
            if (peVar3->size <= iVar9) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
        }
        else {
          text_input_buffer::parse_node_name_abi_cxx11_(&local_198,input);
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar1) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        local_78 = local_1b8;
        if (local_1b8 == 0) {
          text_input_buffer::parse_error(input,"Expected node name");
          this->valid = false;
        }
        else {
          text_input_buffer::next_token(input);
          if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
            push_back(local_138,(value_type *)local_128);
            local_a8 = &local_98;
            local_a0 = 0;
            local_98 = 0;
            local_198._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>((string *)&local_198,local_a8);
            local_178 = &local_168;
            local_170 = 0;
            local_168 = 0;
            local_148 = (pointer)0x0;
            local_158 = (pointer)0x0;
            puStack_150 = (pointer)0x0;
            local_140 = UNKNOWN;
            std::__cxx11::string::operator=((string *)local_128,(string *)&local_198);
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_178);
            puVar6 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar5 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = local_158;
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = puStack_150;
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_148;
            local_158 = (pointer)0x0;
            puStack_150 = (pointer)0x0;
            local_148 = (pointer)0x0;
            if (puVar5 != (pointer)0x0) {
              operator_delete(puVar5,(long)puVar6 - (long)puVar5);
            }
            local_d0 = local_140;
            if (local_158 != (pointer)0x0) {
              operator_delete(local_158,(long)local_148 - (long)local_158);
            }
            if (local_178 != &local_168) {
              operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != paVar1) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_a8 != &local_98) {
              operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
            }
          }
          std::__cxx11::string::_M_assign((string *)&local_108);
          local_d0 = PHANDLE;
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back(local_138,(value_type *)local_128);
          local_c8 = &local_b8;
          local_c0 = 0;
          local_b8 = 0;
          local_198._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>((string *)&local_198,local_c8);
          local_178 = &local_168;
          local_170 = 0;
          local_168 = 0;
          local_148 = (pointer)0x0;
          local_158 = (pointer)0x0;
          puStack_150 = (pointer)0x0;
          local_140 = UNKNOWN;
          std::__cxx11::string::operator=((string *)local_128,(string *)&local_198);
          std::__cxx11::string::operator=((string *)&local_108,(string *)&local_178);
          puVar6 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar5 = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = local_158;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puStack_150;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_148;
          local_158 = (pointer)0x0;
          puStack_150 = (pointer)0x0;
          local_148 = (pointer)0x0;
          if (puVar5 != (pointer)0x0) {
            operator_delete(puVar5,(long)puVar6 - (long)puVar5);
          }
          local_d0 = local_140;
          if (local_158 != (pointer)0x0) {
            operator_delete(local_158,(long)local_148 - (long)local_158);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar1) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
          }
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
      } while (local_78 != 0);
      goto LAB_001219d2;
    }
  }
  __assert_fail("*input == \'<\'",
                "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",0x11b
                ,"void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
  while( true ) {
    if (uVar10 < 10000) goto LAB_00121aab;
    uVar14 = uVar14 / 10000;
    uVar16 = __len + 4;
    if (uVar10 < 100000) break;
LAB_00121a6f:
    __len = uVar16;
    uVar10 = (uint)uVar14;
    if (uVar10 < 100) {
      __len = __len - 2;
      goto LAB_00121aab;
    }
    if (uVar10 < 1000) {
      __len = __len - 1;
      goto LAB_00121aab;
    }
  }
  __len = __len + 1;
LAB_00121aab:
  uVar16 = (uint)local_1a0 >> 0x1f;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - ((char)(local_1a0 >> 0x18) >> 7))
  ;
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar16 + (long)local_70[0]),__len,uVar15);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x13bfbb);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_1b0 = *puVar11;
    lStack_1a8 = plVar8[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *puVar11;
    local_1c0 = (ulong *)*plVar8;
  }
  local_1b8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_198.field_2._M_allocated_capacity = *psVar12;
    local_198.field_2._8_8_ = plVar8[3];
    local_198._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar12;
    local_198._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_198._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  text_input_buffer::parse_error(input,local_198._M_dataplus._M_p);
  this->valid = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
LAB_001219d2:
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,
                    CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  return;
}

Assistant:

void
property::parse_cells(text_input_buffer &input, int cell_size)
{
	assert(*input == '<');
	++input;
	property_value v;
	input.next_token();
	while (!input.consume('>'))
	{
		input.next_token();
		// If this is a phandle then we need to get the name of the
		// referenced node
		if (input.consume('&'))
		{
			if (cell_size != 32)
			{
				input.parse_error("reference only permitted in 32-bit arrays");
				valid = false;
				return;
			}
			input.next_token();
			string referenced;
			if (!input.consume('{'))
			{
				referenced = input.parse_node_name();
			}
			else
			{
				referenced = input.parse_to('}');
				input.consume('}');
			}
			if (referenced.empty())
			{
				input.parse_error("Expected node name");
				valid = false;
				return;
			}
			input.next_token();
			// If we already have some bytes, make the phandle a
			// separate component.
			if (!v.byte_data.empty())
			{
				values.push_back(v);
				v = property_value();
			}
			v.string_data = referenced;
			v.type = property_value::PHANDLE;
			values.push_back(v);
			v = property_value();
		}
		else
		{
			//FIXME: We should support labels in the middle
			//of these, but we don't.
			unsigned long long val;
			if (!input.consume_integer_expression(val))
			{
				// FIXME: Distinguish invalid syntax from a
				// number that cannot be represented in an
				// unsigned long long.
				input.parse_error("Expected numbers in array of cells");
				valid = false;
				return;
			}
			// FIXME: No sign information available, so cannot
			// distinguish small negative values from large
			// positive ones, and thus we have to conservatively
			// permit anything that looks like a sign-extended
			// negative integer.
			if (cell_size < 64 && val >= (1ull << cell_size) &&
			    (val | ((1ull << (cell_size - 1)) - 1)) !=
			    std::numeric_limits<unsigned long long>::max())
			{
				std::string msg = "Value does not fit in a " +
					std::to_string(cell_size) + "-bit cell";
				input.parse_error(msg.c_str());
				valid = false;
				return;
			}
			switch (cell_size)
			{
				case 8:
					v.byte_data.push_back(val);
					break;
				case 16:
					push_big_endian(v.byte_data, (uint16_t)val);
					break;
				case 32:
					push_big_endian(v.byte_data, (uint32_t)val);
					break;
				case 64:
					push_big_endian(v.byte_data, (uint64_t)val);
					break;
				default:
					assert(0 && "Invalid cell size!");
			}
			input.next_token();
		}
	}
	// Don't store an empty string value here.
	if (v.byte_data.size() > 0)
	{
		values.push_back(v);
	}
}